

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIComboBox::updateListButtonWidth(CGUIComboBox *this,s32 width)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  rect<int> *in_stack_00000008;
  rect<int> r;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  rect<int> local_1c;
  int local_c;
  
  local_c = in_ESI;
  local_1c = IGUIElement::getRelativePosition(*(IGUIElement **)(in_RDI + 0x138));
  iVar1 = core::rect<int>::getWidth(&local_1c);
  if (iVar1 != local_c) {
    core::rect<int>::rect
              ((rect<int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    core::rect<int>::getWidth((rect<int> *)(in_RDI + 0x30));
    core::rect<int>::getWidth((rect<int> *)(in_RDI + 0x30));
    core::rect<int>::getHeight((rect<int> *)(in_RDI + 0x30));
    IGUIElement::setRelativePosition((IGUIElement *)r._4_8_,in_stack_00000008);
    core::rect<int>::getWidth((rect<int> *)(in_RDI + 0x30));
    core::rect<int>::getHeight((rect<int> *)(in_RDI + 0x30));
    IGUIElement::setRelativePosition((IGUIElement *)r._4_8_,in_stack_00000008);
  }
  return;
}

Assistant:

void CGUIComboBox::updateListButtonWidth(s32 width)
{
	if (ListButton->getRelativePosition().getWidth() != width) {
		core::rect<s32> r;
		r.UpperLeftCorner.X = RelativeRect.getWidth() - width - 2;
		r.LowerRightCorner.X = RelativeRect.getWidth() - 2;
		r.UpperLeftCorner.Y = 2;
		r.LowerRightCorner.Y = RelativeRect.getHeight() - 2;
		ListButton->setRelativePosition(r);

		r.UpperLeftCorner.X = 2;
		r.UpperLeftCorner.Y = 2;
		r.LowerRightCorner.X = RelativeRect.getWidth() - (width + 2);
		r.LowerRightCorner.Y = RelativeRect.getHeight() - 2;
		SelectedText->setRelativePosition(r);
	}
}